

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcphuff.c
# Opt level: O0

int encode_mcu_AC_refine_prepare
              (JCOEF *block,int *jpeg_natural_order_start,int Sl,int Al,JCOEF *absvalues,
              size_t *bits)

{
  uint uVar1;
  int iVar2;
  int Sl0;
  size_t signbits;
  size_t zerobits;
  int EOB;
  int temp2;
  int temp;
  int k;
  size_t *bits_local;
  JCOEF *absvalues_local;
  int Al_local;
  int Sl_local;
  int *jpeg_natural_order_start_local;
  JCOEF *block_local;
  
  EOB = 0;
  zerobits = 0;
  signbits = 0;
  for (k = 0; k < Sl; k = k + 1) {
    uVar1 = (int)block[jpeg_natural_order_start[k]] >> 0x1f;
    iVar2 = (int)((uVar1 ^ (int)block[jpeg_natural_order_start[k]]) - uVar1) >> ((byte)Al & 0x1f);
    if (iVar2 != 0) {
      zerobits = 1L << ((byte)k & 0x3f) | zerobits;
      signbits = (long)(int)(uVar1 + 1) << ((byte)k & 0x3f) | signbits;
    }
    absvalues[k] = (JCOEF)iVar2;
    if (iVar2 == 1) {
      EOB = k;
    }
  }
  *bits = zerobits;
  bits[1] = signbits;
  return EOB;
}

Assistant:

METHODDEF(int)
encode_mcu_AC_refine_prepare(const JCOEF *block,
                             const int *jpeg_natural_order_start, int Sl,
                             int Al, JCOEF *absvalues, size_t *bits)
{
  register int k, temp, temp2;
  int EOB = 0;
  size_t zerobits = 0U, signbits = 0U;
  int Sl0 = Sl;

#if SIZEOF_SIZE_T == 4
  if (Sl0 > 32)
    Sl0 = 32;
#endif

  COMPUTE_ABSVALUES_AC_REFINE(Sl0, 0);

  bits[0] = zerobits;
#if SIZEOF_SIZE_T == 8
  bits[1] = signbits;
#else
  bits[2] = signbits;

  zerobits = 0U;
  signbits = 0U;

  if (Sl > 32) {
    Sl -= 32;
    jpeg_natural_order_start += 32;
    absvalues += 32;

    COMPUTE_ABSVALUES_AC_REFINE(Sl, 32);
  }

  bits[1] = zerobits;
  bits[3] = signbits;
#endif

  return EOB;
}